

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserParserTemplateBase.cpp
# Opt level: O2

bool __thiscall
GeneratedSaxParser::ParserTemplateBase::handleError
          (ParserTemplateBase *this,Severity severity,ErrorType errorType,StringHash elementHash,
          ParserChar *attribute,ParserChar *additionalText)

{
  IErrorHandler *pIVar1;
  int iVar2;
  size_t lineNumber;
  size_t columnNumber;
  byte bVar3;
  char *__s;
  allocator<char> local_b9;
  char *local_b8;
  ParserChar *local_b0;
  StringHash elementHash_local;
  String local_a0;
  ParserError error;
  
  pIVar1 = (this->super_Parser).mErrorHandler;
  if (pIVar1 == (IErrorHandler *)0x0) {
    bVar3 = severity == SEVERITY_CRITICAL;
  }
  else {
    local_b0 = attribute;
    elementHash_local = elementHash;
    local_b8 = getNameByStringHash(this,&elementHash_local);
    lineNumber = Parser::getLineNumber(&this->super_Parser);
    columnNumber = Parser::getColumnNumber(&this->super_Parser);
    __s = "";
    if (additionalText != (ParserChar *)0x0) {
      __s = additionalText;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,__s,&local_b9);
    ParserError::ParserError
              (&error,severity,errorType,local_b8,local_b0,lineNumber,columnNumber,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    iVar2 = (*pIVar1->_vptr_IErrorHandler[2])(pIVar1,&error);
    bVar3 = severity == SEVERITY_CRITICAL | (byte)iVar2;
    ParserError::~ParserError(&error);
  }
  return (bool)bVar3;
}

Assistant:

bool ParserTemplateBase::handleError( ParserError::Severity severity,
        ParserError::ErrorType errorType,
        StringHash elementHash,
        const ParserChar* attribute,
        const ParserChar* additionalText /*= ""*/ )
    {
        IErrorHandler* errorHandler = getErrorHandler();
        if ( !errorHandler )
            return (severity == ParserError::SEVERITY_CRITICAL) ? true : false;

        ParserError error(severity,
            errorType,
            getNameByStringHash(elementHash),
            attribute,
            getLineNumber(),
            getColumnNumber(),
            additionalText ? (const char*)additionalText : "");
        bool handlerWantsToAbort = errorHandler->handleError(error);

        return (severity == ParserError::SEVERITY_CRITICAL) ? true : handlerWantsToAbort;
    }